

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

void unknown_toUtf8(ENCODING *enc,char **fromP,char *fromLim,char **toP,char *toLim)

{
  char cVar1;
  int c_00;
  char *pcVar2;
  char **ppcVar3;
  int local_44;
  int c;
  int n;
  char *utf8;
  char *pcStack_30;
  char buf [4];
  char *toLim_local;
  char **toP_local;
  char *fromLim_local;
  char **fromP_local;
  ENCODING *enc_local;
  
  ppcVar3 = (char **)fromLim;
  pcStack_30 = toLim;
  do {
    if (*fromP == fromLim) {
      return;
    }
    pcVar2 = (char *)((long)enc[6].literalScanners + (ulong)(byte)**fromP * 4 + 0x68);
    _c = pcVar2 + 1;
    local_44 = (int)*pcVar2;
    if (local_44 == 0) {
      c_00 = (*enc[3].literalScanners[1])((ENCODING *)enc[3].sameName,*fromP,(char *)ppcVar3,fromP);
      local_44 = cm_expat_XmlUtf8Encode(c_00,(char *)((long)&utf8 + 4));
      if ((long)pcStack_30 - (long)*toP < (long)local_44) {
        return;
      }
      _c = (char *)((long)&utf8 + 4);
      *fromP = *fromP + (int)(*(byte *)((long)enc[1].scanners + (ulong)(byte)**fromP) - 3);
    }
    else {
      if ((long)pcStack_30 - (long)*toP < (long)local_44) {
        return;
      }
      *fromP = *fromP + 1;
    }
    do {
      cVar1 = *_c;
      pcVar2 = *toP;
      *toP = pcVar2 + 1;
      *pcVar2 = cVar1;
      local_44 = local_44 + -1;
      ppcVar3 = toP;
      _c = _c + 1;
    } while (local_44 != 0);
  } while( true );
}

Assistant:

static
void unknown_toUtf8(const ENCODING *enc,
                    const char **fromP, const char *fromLim,
                    char **toP, const char *toLim)
{
  char buf[XML_UTF8_ENCODE_MAX];
  for (;;) {
    const char *utf8;
    int n;
    if (*fromP == fromLim)
      break;
    utf8 = ((const struct unknown_encoding *)enc)->utf8[(unsigned char)**fromP];
    n = *utf8++;
    if (n == 0) {
      int c = ((const struct unknown_encoding *)enc)
              ->convert(((const struct unknown_encoding *)enc)->userData, *fromP);
      n = XmlUtf8Encode(c, buf);
      if (n > toLim - *toP)
        break;
      utf8 = buf;
      *fromP += ((const struct normal_encoding *)enc)->type[(unsigned char)**fromP]
                 - (BT_LEAD2 - 2);
    }
    else {
      if (n > toLim - *toP)
        break;
      (*fromP)++;
    }
    do {
      *(*toP)++ = *utf8++;
    } while (--n != 0);
  }
}